

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O2

void u8_to_U_test(int line,UTF_S8 *str1,UTF_US32 *str2,bool ok)

{
  UTF_UC8 uc8_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  UTF_UC8 *pUVar6;
  undefined4 *puVar7;
  UTF_UC8 *pUVar8;
  UTF_UC8 *pUVar9;
  long lVar10;
  UTF_UC32 local_464;
  UTF_UC8 uc8 [4];
  UTF_US32 tmp;
  UTF_UC32 buf [256];
  
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = L'\0';
  bVar1 = UTF_u8_to_U<(char)63>((UTF_US8 *)str1,&tmp);
  UTF_test(line,bVar1 == ok);
  bVar1 = std::operator==(&tmp,str2);
  UTF_test(line,bVar1);
  pUVar9 = (UTF_UC8 *)(str1->_M_dataplus)._M_p;
  pUVar6 = pUVar9 + str1->_M_string_length;
  lVar10 = 0;
  while( true ) {
    puVar7 = (undefined4 *)((long)buf + lVar10);
    bVar1 = pUVar9 == pUVar6;
    if (bVar1) break;
    uc8_00 = *pUVar9;
    uVar3 = UTF_uc8_count(uc8_00);
    if (uVar3 == 0) {
      local_464 = L'?';
    }
    else {
      for (uVar5 = 1; pUVar8 = pUVar9 + 1, uc8[0] = uc8_00, uVar3 != uVar5; uVar5 = uVar5 + 1) {
        if (pUVar8 == pUVar6) {
          if (lVar10 != 0x3fc) {
            *puVar7 = 0x3f;
            puVar7 = (undefined4 *)((long)buf + lVar10 + 4);
            goto LAB_0010167c;
          }
          bVar1 = false;
          goto LAB_0010167f;
        }
        uc8[uVar5] = *pUVar8;
        pUVar9 = pUVar8;
      }
      bVar2 = UTF_uc8_to_uc32(uc8,&local_464);
      if (!bVar2) goto LAB_0010167f;
    }
    if (lVar10 == 0x3fc) goto LAB_0010167f;
    *(UTF_UC32 *)((long)buf + lVar10) = local_464;
    lVar10 = lVar10 + 4;
    pUVar9 = pUVar9 + 1;
  }
LAB_0010167c:
  bVar1 = true;
LAB_0010167f:
  *puVar7 = 0;
  UTF_test(line,bVar1);
  iVar4 = UTF_uj32_cmpn(tmp._M_dataplus._M_p,buf,tmp._M_string_length + 1);
  UTF_test(line,iVar4 == 0);
  std::__cxx11::u32string::~u32string((u32string *)&tmp);
  return;
}

Assistant:

void u8_to_U_test(int line, const UTF_S8& str1, const UTF_US32& str2, bool ok)
{
    UTF_US32 tmp;
    UTF_UC32 buf[256];
    UTF_test(line, UTF_u8_to_U<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_j8_to_uj32(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj32_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}